

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip38.c
# Opt level: O0

void aes_dec_impl(uchar *cyphertext,uchar *xor,uchar *key,uchar *bytes_out)

{
  ulong local_30;
  size_t i;
  uchar *bytes_out_local;
  uchar *key_local;
  uchar *xor_local;
  uchar *cyphertext_local;
  
  wally_aes(key,0x20,cyphertext,0x10,2,bytes_out,0x10);
  for (local_30 = 0; local_30 < 0x10; local_30 = local_30 + 1) {
    bytes_out[local_30] = bytes_out[local_30] ^ xor[local_30];
  }
  return;
}

Assistant:

static void aes_dec_impl(const unsigned char *cyphertext, const unsigned char *xor,
                         const unsigned char *key, unsigned char *bytes_out)
{
    size_t i;

    wally_aes(key, AES_KEY_LEN_256,
              (unsigned char *)cyphertext, AES_BLOCK_LEN,
              AES_FLAG_DECRYPT,
              bytes_out, AES_BLOCK_LEN);

    for (i = 0; i < AES_BLOCK_LEN; ++i)
        bytes_out[i] ^= xor[i];
}